

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

int duckdb::UnaryLambdaWrapper::
    Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
              (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  ConversionException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58 [32];
  string local_38;
  
  if ((**(int **)mask <= input) && (input <= **(int **)(mask + 8))) {
    return input;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_58,"Value %s is outside of range [%s,%s]",&local_b9);
  std::__cxx11::to_string(&local_78,input);
  std::__cxx11::to_string(&local_98,**(int **)mask);
  std::__cxx11::to_string(&local_b8,**(int **)(mask + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_38,(StringUtil *)local_58,&local_78,&local_98,&local_b8,in_R9);
  duckdb::ConversionException::ConversionException(this,(string *)&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input);
	}